

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem singlestep(lua_State *L)

{
  int iVar1;
  int iVar2;
  global_State *g_00;
  GCObject *pGVar3;
  UpVal *pUVar4;
  lu_mem lVar5;
  GCObject *pGVar6;
  GCObject *pGVar7;
  lu_mem lVar8;
  lu_mem lVar9;
  lu_mem lVar10;
  global_State *pgVar11;
  uint newsize;
  GCObject **ppGVar12;
  char *pcVar13;
  GCObject *f;
  GCObject *f_00;
  global_State *g;
  long lVar14;
  int iVar15;
  lu_mem lVar16;
  GCObject *mt;
  
  g_00 = L->l_G;
  lVar16 = 0;
  switch(g_00->gcstate) {
  case '\0':
    if (g_00->gray == (GCObject *)0x0) {
      g_00->gcstate = '\x01';
      lVar16 = g_00->GCmemtrav;
      g_00->GCestimate = lVar16;
      if ((L->marked & 3) != 0) {
        reallymarkobject(g_00,(GCObject *)L);
      }
      if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
         (pGVar3 = (g_00->l_registry).value_.gc, ((pGVar3->gch).marked & 3) != 0)) {
        reallymarkobject(g_00,pGVar3);
      }
      markmt(g_00);
      pUVar4 = &g_00->uvhead;
      while (pUVar4 = (pUVar4->u).l.next, pUVar4 != &g_00->uvhead) {
        if ((((pUVar4->marked & 7) == 0) && ((pUVar4->v->tt_ & 0x40) != 0)) &&
           (pGVar3 = (pUVar4->v->value_).gc, ((pGVar3->gch).marked & 3) != 0)) {
          reallymarkobject(g_00,pGVar3);
        }
      }
      propagateall(g_00);
      pGVar3 = g_00->weak;
      lVar5 = g_00->GCmemtrav;
      pGVar6 = g_00->grayagain;
      pGVar7 = g_00->ephemeron;
      g_00->grayagain = (GCObject *)0x0;
      g_00->weak = (GCObject *)0x0;
      g_00->ephemeron = (GCObject *)0x0;
      propagateall(g_00);
      g_00->gray = pGVar6;
      propagateall(g_00);
      g_00->gray = pGVar3;
      propagateall(g_00);
      g_00->gray = pGVar7;
      propagateall(g_00);
      lVar8 = g_00->GCmemtrav;
      convergeephemerons(g_00);
      clearvalues(g_00,g_00->weak,(GCObject *)0x0);
      clearvalues(g_00,g_00->allweak,(GCObject *)0x0);
      pGVar3 = g_00->weak;
      pGVar6 = g_00->allweak;
      lVar9 = g_00->GCmemtrav;
      separatetobefnz(L,0);
      markbeingfnz(g_00);
      propagateall(g_00);
      lVar10 = g_00->GCmemtrav;
      convergeephemerons(g_00);
      clearkeys(g_00,g_00->ephemeron,f);
      clearkeys(g_00,g_00->allweak,f_00);
      clearvalues(g_00,g_00->weak,pGVar3);
      clearvalues(g_00,g_00->allweak,pGVar6);
      g_00->currentwhite = g_00->currentwhite ^ 3;
      lVar14 = ((lVar5 + lVar9) - (lVar16 + lVar8 + lVar10)) + g_00->GCmemtrav;
      g_00->GCestimate = g_00->GCestimate + lVar14;
      iVar15 = entersweep(L);
      lVar16 = (long)iVar15 * 7 + lVar14;
    }
    else {
      lVar16 = g_00->GCmemtrav;
      propagatemark(g_00);
      lVar16 = g_00->GCmemtrav - lVar16;
    }
    break;
  case '\x02':
    lVar16 = 0;
    iVar15 = 0;
    while( true ) {
      iVar2 = (g_00->strt).size;
      if ((iVar15 == 0x55) || (iVar1 = g_00->sweepstrgc + iVar15, iVar2 <= iVar1)) break;
      sweeplist(L,(g_00->strt).hash + iVar1,0xfffffffffffffffd);
      iVar15 = iVar15 + 1;
      lVar16 = lVar16 + 7;
    }
    iVar15 = iVar15 + g_00->sweepstrgc;
    g_00->sweepstrgc = iVar15;
    if (iVar2 <= iVar15) {
      g_00->gcstate = '\x03';
    }
    break;
  case '\x03':
    if (g_00->sweepfin == (GCObject **)0x0) {
      g_00->gcstate = '\x04';
      return 0;
    }
    ppGVar12 = sweeplist(L,g_00->sweepfin,0x55);
    g_00->sweepfin = ppGVar12;
    goto LAB_0010983f;
  case '\x04':
    if (g_00->sweepgc == (GCObject **)0x0) {
      mt = (GCObject *)g_00->mainthread;
      sweeplist(L,&mt,1);
      pgVar11 = L->l_G;
      if (pgVar11->gckind != '\x01') {
        newsize = (pgVar11->strt).size / 2;
        if ((pgVar11->strt).nuse < newsize) {
          luaS_resize(L,newsize);
        }
        pcVar13 = (char *)luaM_realloc_(L,(pgVar11->buff).buffer,(pgVar11->buff).buffsize,0);
        (pgVar11->buff).buffer = pcVar13;
        (pgVar11->buff).buffsize = 0;
      }
      g_00->gcstate = '\x05';
      return 7;
    }
    ppGVar12 = sweeplist(L,g_00->sweepgc,0x55);
    g_00->sweepgc = ppGVar12;
LAB_0010983f:
    lVar16 = 0x253;
    break;
  case '\x05':
    g_00->GCmemtrav = (long)(g_00->strt).size << 3;
    g_00->allweak = (GCObject *)0x0;
    g_00->gray = (GCObject *)0x0;
    g_00->grayagain = (GCObject *)0x0;
    g_00->weak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    pGVar3 = (GCObject *)g_00->mainthread;
    if ((pGVar3 != (GCObject *)0x0) && (((pGVar3->gch).marked & 3) != 0)) {
      reallymarkobject(g_00,pGVar3);
    }
    if ((((g_00->l_registry).tt_ & 0x40) != 0) &&
       (pGVar3 = (g_00->l_registry).value_.gc, ((pGVar3->gch).marked & 3) != 0)) {
      reallymarkobject(g_00,pGVar3);
    }
    markmt(g_00);
    markbeingfnz(g_00);
    g_00->gcstate = '\0';
    lVar16 = g_00->GCmemtrav;
  }
  return lVar16;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  switch (g->gcstate) {
    case GCSpause: {
      /* start to count memory traversed */
      g->GCmemtrav = g->strt.size * sizeof(GCObject*);
      lua_assert(!isgenerational(g));
      restartcollection(g);
      g->gcstate = GCSpropagate;
      return g->GCmemtrav;
    }
    case GCSpropagate: {
      if (g->gray) {
        lu_mem oldtrav = g->GCmemtrav;
        propagatemark(g);
        return g->GCmemtrav - oldtrav;  /* memory traversed in this step */
      }
      else {  /* no more `gray' objects */
        lu_mem work;
        int sw;
        g->gcstate = GCSatomic;  /* finish mark phase */
        g->GCestimate = g->GCmemtrav;  /* save what was counted */;
        work = atomic(L);  /* add what was traversed by 'atomic' */
        g->GCestimate += work;  /* estimate of total memory traversed */ 
        sw = entersweep(L);
        return work + sw * GCSWEEPCOST;
      }
    }
    case GCSsweepstring: {
      int i;
      for (i = 0; i < GCSWEEPMAX && g->sweepstrgc + i < g->strt.size; i++)
        sweepwholelist(L, &g->strt.hash[g->sweepstrgc + i]);
      g->sweepstrgc += i;
      if (g->sweepstrgc >= g->strt.size)  /* no more strings to sweep? */
        g->gcstate = GCSsweepudata;
      return i * GCSWEEPCOST;
    }
    case GCSsweepudata: {
      if (g->sweepfin) {
        g->sweepfin = sweeplist(L, g->sweepfin, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        g->gcstate = GCSsweep;
        return 0;
      }
    }
    case GCSsweep: {
      if (g->sweepgc) {
        g->sweepgc = sweeplist(L, g->sweepgc, GCSWEEPMAX);
        return GCSWEEPMAX*GCSWEEPCOST;
      }
      else {
        /* sweep main thread */
        GCObject *mt = obj2gco(g->mainthread);
        sweeplist(L, &mt, 1);
        checkSizes(L);
        g->gcstate = GCSpause;  /* finish collection */
        return GCSWEEPCOST;
      }
    }
    default: lua_assert(0); return 0;
  }
}